

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::argument_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,Parameter *arg)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  BaseType BVar4;
  Dim DVar5;
  StorageClass SVar6;
  string *psVar7;
  bool bVar8;
  ExecutionModel EVar9;
  SPIRVariable *pSVar10;
  SPIRType *pSVar11;
  SPIRType *pSVar12;
  undefined4 extraout_var;
  undefined8 *puVar13;
  const_iterator cVar14;
  Bitset *pBVar15;
  SPIRType *pSVar16;
  long *plVar17;
  char *pcVar18;
  BuiltIn builtin;
  uint uVar19;
  int iVar20;
  _Base_ptr p_Var21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  size_type *psVar22;
  char (*pacVar23) [2];
  ulong *puVar24;
  _Base_ptr p_Var25;
  uint32_t uVar26;
  _Base_ptr p_Var27;
  _Alloc_hider _Var28;
  undefined8 uVar29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  bool bVar30;
  string *decl;
  string type_name;
  uint32_t array_size;
  char *cv_qualifier;
  string address_space;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char (*in_stack_fffffffffffffeb8) [3];
  string local_138;
  uint32_t local_118;
  byte local_111;
  string local_110;
  char local_e9;
  char *local_e8;
  int local_e0 [2];
  ulong local_d8;
  SPIRType *local_d0;
  uint local_c4;
  SPIRType *local_c0;
  string local_b8;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  pSVar10 = Variant::get<spirv_cross::SPIRVariable>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + (arg->id).id);
  pSVar11 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + (arg->type).id);
  local_d8 = (ulong)pSVar11->storage;
  pSVar12 = Compiler::get_variable_data_type((Compiler *)this,pSVar10);
  local_e9 = Compiler::is_physical_pointer((Compiler *)this,pSVar11);
  pSVar16 = pSVar11;
  if (!(bool)local_e9) {
    pSVar16 = pSVar12;
  }
  local_118 = (pSVar10->super_IVariant).self.id;
  local_d0 = pSVar12;
  local_c0 = pSVar11;
  if (arg->alias_global_variable == true) {
    uVar26 = (pSVar10->basevariable).id;
    if (uVar26 != 0) {
      local_118 = uVar26;
    }
LAB_0022011c:
    bVar30 = false;
  }
  else {
    if (((bool)local_e9) || (bVar30 = Compiler::is_pointer((Compiler *)this,pSVar11), !bVar30))
    goto LAB_0022011c;
    bVar30 = arg->write_count == 0;
  }
  BVar4 = pSVar16->basetype;
  DVar5 = (pSVar16->image).dim;
  if ((DVar5 == DimSubpassData && BVar4 == Image) &&
     ((this->msl_options).use_framebuffer_fetch_subpasses != false)) {
    bVar30 = false;
  }
  else {
    bVar30 = (bool)((int)local_d8 == 0 | bVar30);
  }
  local_c4 = BVar4 - AccelerationStructure;
  local_e8 = "const ";
  if (!bVar30) {
    local_e8 = "";
  }
  if (0xfffffffc < local_c4) {
    local_e8 = "";
  }
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((DVar5 == Dim2D & BVar4 == SampledImage & ~arg->alias_global_variable) == 1) &&
     (pSVar11 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + (pSVar16->image).type.id),
     pSVar11->basetype - Half < 3)) {
    p_Var25 = (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent;
    p_Var1 = &(this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header;
    p_Var21 = &p_Var1->_M_header;
    p_Var27 = &p_Var1->_M_header;
    if (p_Var25 != (_Base_ptr)0x0) {
      do {
        bVar30 = (byte)(char)p_Var25[1]._M_color < 0x44;
        if (!bVar30) {
          p_Var21 = p_Var25;
        }
        p_Var25 = (&p_Var25->_M_left)[bVar30];
      } while (p_Var25 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var21 != p_Var1) &&
         (p_Var27 = p_Var21, 0x44 < (byte)(char)p_Var21[1]._M_color)) {
        p_Var27 = &p_Var1->_M_header;
      }
    }
    bVar30 = (_Rb_tree_header *)p_Var27 != p_Var1;
  }
  else {
    bVar30 = false;
  }
  get_argument_address_space_abi_cxx11_(&local_b8,this,pSVar10);
  local_111 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(pSVar10->super_IVariant).self.id,DecorationBuiltIn);
  local_e0[0] = Compiler::get_decoration((Compiler *)this,(ID)(arg->id).id,DecorationBuiltIn);
  local_e0[1] = extraout_var;
  uVar26 = (pSVar10->basevariable).id;
  if ((uVar26 == 0) ||
     ((uVar26 != (this->stage_in_ptr_var_id).id && (uVar26 != (this->stage_out_ptr_var_id).id)))) {
    if ((local_111 != 0) &&
       (EVar9 = Compiler::get_execution_model((Compiler *)this), EVar9 != ExecutionModelMeshEXT)) {
      pSVar11 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr +
                           *(uint *)&(pSVar10->super_IVariant).field_0xc);
      SVar6 = pSVar11->storage;
      builtin = local_e0[0];
      if ((builtin - BuiltInTessLevelOuter < 2) && (SVar6 == StorageClassInput)) {
        bVar8 = false;
LAB_002203fc:
        this->is_using_builtin_array = bVar8;
      }
      else {
        if (builtin - BuiltInVertexId < 0xfffffffe) {
          this->is_using_builtin_array = true;
        }
        if ((SVar6 == StorageClassOutput) && ((this->capture_output_to_buffer & 1U) == 0)) {
          bVar30 = CompilerGLSL::is_stage_output_builtin_masked(&this->super_CompilerGLSL,builtin);
          bVar8 = true;
          if (!bVar30) goto LAB_002203fc;
        }
      }
      if (this->is_using_builtin_array == true) {
        uVar19 = (arg->id).id;
        ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar19;
        builtin_type_decl_abi_cxx11_(&local_110,this,local_e0[0],uVar19);
        join<char_const*&,std::__cxx11::string>
                  (&local_138,(spirv_cross *)&local_e8,(char **)&local_110,ts_1);
      }
      else {
        ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)(arg->id).id;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_110,this,pSVar16);
        join<char_const*&,std::__cxx11::string>
                  (&local_138,(spirv_cross *)&local_e8,(char **)&local_110,ts_1);
      }
      goto LAB_002206d2;
    }
    bVar8 = is_var_runtime_size_array(this,pSVar10);
    if (bVar8) {
      pSVar11 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + (pSVar16->parent_type).id);
      pacVar23 = (char (*) [2])(this->super_CompilerGLSL).super_Compiler._vptr_Compiler;
      (**(_func_int **)(pacVar23 + 0x4c))(&local_138,this,pSVar11,(ulong)(arg->id).id);
      if (pSVar16->basetype == AccelerationStructure) {
        join<char_const(&)[20],std::__cxx11::string&,char_const(&)[2]>
                  (&local_110,(spirv_cross *)"spvDescriptorArray<",(char (*) [20])&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d188a,
                   pacVar23);
      }
      else if (local_c4 < 0xfffffffd) {
        in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d1889;
        join<char_const(&)[20],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3]>
                  (&local_110,(spirv_cross *)"spvDescriptorArray<",(char (*) [20])&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bb1d1,
                   (char (*) [2])&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d1889,
                   in_stack_fffffffffffffeb8);
      }
      else {
        join<char_const(&)[20],char_const*&,std::__cxx11::string&,char_const(&)[2]>
                  (&local_110,(spirv_cross *)"spvDescriptorArray<",(char (*) [20])&local_e8,
                   (char **)&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d188a,
                   (char (*) [2])in_R9);
      }
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d3fe4;
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5;
      ::std::__cxx11::string::_M_replace
                ((ulong)&local_b8,0,(char *)local_b8._M_string_length,0x2d3fe4);
      psVar7 = &local_138;
      goto LAB_002206fb;
    }
    if ((((int)local_d8 == 0xc) || ((int)local_d8 == 2)) &&
       (bVar8 = Compiler::is_array((Compiler *)this,pSVar16), bVar8)) {
      this->is_using_builtin_array = true;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&local_110,this,pSVar16,(ulong)(arg->id).id);
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c17b3;
      join<char_const*&,std::__cxx11::string,char_const(&)[2]>
                (&local_138,(spirv_cross *)&local_e8,(char **)&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c17b3,
                 (char (*) [2])in_R8);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
      goto LAB_002206ec;
    }
    if (bVar30) {
      pSVar11 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + (pSVar16->image).type.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_110,this,pSVar11,0);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d188a;
      join<char_const*&,char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                (&local_138,(spirv_cross *)&local_e8,(char **)"spvDynamicImageSampler<",
                 (char (*) [24])&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d188a,
                 (char (*) [2])in_R9);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      Compiler::set_extended_decoration
                ((Compiler *)this,(arg->id).id,SPIRVCrossDecorationDynamicImageSampler,0);
      goto LAB_00220709;
    }
    bVar30 = Compiler::is_pointer((Compiler *)this,local_d0);
    if (!bVar30) {
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(arg->id).id;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_110,this,pSVar16);
      join<char_const*&,std::__cxx11::string>
                (&local_138,(spirv_cross *)&local_e8,(char **)&local_110,ts_1);
      goto LAB_002206d2;
    }
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)(arg->id).id;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_138,this,pSVar16);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if (*local_e8 != '\0') {
      join<char_const(&)[2],char_const*&>
                (&local_138,(spirv_cross *)0x2bb1d1,(char (*) [2])&local_e8,(char **)ts_1);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
      _Var28._M_p = local_138._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_00220709;
      goto LAB_00220704;
    }
  }
  else {
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)(arg->id).id;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_110,this,pSVar16);
    join<char_const*&,std::__cxx11::string>
              (&local_138,(spirv_cross *)&local_e8,(char **)&local_110,ts_1);
LAB_002206d2:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_138);
LAB_002206ec:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    psVar7 = &local_110;
LAB_002206fb:
    _Var28._M_p = *(pointer *)((psVar7->field_2)._M_local_buf + -0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var28._M_p != &psVar7->field_2) {
LAB_00220704:
      operator_delete(_Var28._M_p);
    }
  }
LAB_00220709:
  if (local_e9 == '\0') {
    if (local_111 == 0) {
      bVar30 = Compiler::is_pointer((Compiler *)this,local_c0);
      uVar19 = (int)local_d8 - 9;
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)CONCAT31((int3)(uVar19 >> 8),uVar19 < 0xfffffffe);
      if (!bVar30 && uVar19 >= 0xfffffffe) goto LAB_00220714;
    }
    bVar30 = Compiler::is_array((Compiler *)this,local_d0);
    pacVar23 = (char (*) [2])CONCAT71((int7)((ulong)ts_1 >> 8),0xfffffffc < local_c4);
    if (!bVar30 || 0xfffffffc < local_c4) {
      if ((BVar4 & ~SByte) == Image) {
        bVar30 = is_var_runtime_size_array(this,pSVar10);
        uVar26 = local_118;
        if (bVar30) {
          local_78[0] = &local_68;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_78,local_b8._M_dataplus._M_p,
                     (char *)(local_b8._M_string_length + (long)local_b8._M_dataplus._M_p));
          ::std::__cxx11::string::append((char *)local_78);
          plVar17 = (long *)::std::__cxx11::string::_M_append
                                      ((char *)local_78,
                                       (ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
          psVar22 = (size_type *)(plVar17 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar22) {
            local_98.field_2._M_allocated_capacity = *psVar22;
            local_98.field_2._8_8_ = plVar17[3];
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          }
          else {
            local_98.field_2._M_allocated_capacity = *psVar22;
            local_98._M_dataplus._M_p = (pointer)*plVar17;
          }
          local_98._M_string_length = plVar17[1];
          *plVar17 = (long)psVar22;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          puVar13 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
          paVar2 = &local_110.field_2;
          puVar24 = puVar13 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_110.field_2._M_allocated_capacity = *puVar24;
            local_110.field_2._8_8_ = puVar13[3];
            local_110._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_110.field_2._M_allocated_capacity = *puVar24;
            local_110._M_dataplus._M_p = (pointer)*puVar13;
          }
          local_110._M_string_length = puVar13[1];
          *puVar13 = puVar24;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,local_118,true)
          ;
          uVar29 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != paVar2) {
            uVar29 = local_110.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar29 < local_50._M_string_length + local_110._M_string_length) {
            in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &local_50.field_2;
            uVar29 = 0xf;
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_50._M_dataplus._M_p != in_R9) {
              uVar29 = local_50.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar29 < local_50._M_string_length + local_110._M_string_length)
            goto LAB_0022137c;
            puVar13 = (undefined8 *)
                      ::std::__cxx11::string::replace
                                ((ulong)&local_50,0,(char *)0x0,(ulong)local_110._M_dataplus._M_p);
          }
          else {
LAB_0022137c:
            puVar13 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_110,(ulong)local_50._M_dataplus._M_p);
          }
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          psVar22 = puVar13 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar22) {
            local_138.field_2._M_allocated_capacity = *psVar22;
            local_138.field_2._8_8_ = puVar13[3];
          }
          else {
            local_138.field_2._M_allocated_capacity = *psVar22;
            local_138._M_dataplus._M_p = (pointer)*puVar13;
          }
          local_138._M_string_length = puVar13[1];
          *puVar13 = psVar22;
          puVar13[1] = 0;
          *(char *)psVar22 = '\0';
          ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != paVar2) {
            operator_delete(local_110._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          _Var28._M_p = (pointer)local_78[0];
          uVar26 = local_118;
          if (local_78[0] == &local_68) goto LAB_002209c3;
          goto LAB_002209be;
        }
        if ((local_d0->array).super_VectorView<unsigned_int>.buffer_size != 0) {
          local_110._M_dataplus._M_p =
               descriptor_address_space(this,local_118,(StorageClass)local_d8,"thread const");
          join<char_const*&,char_const(&)[2],std::__cxx11::string&>
                    (&local_138,(spirv_cross *)&local_110,(char **)0x2bb1d1,
                     (char (*) [2])__return_storage_ptr__,in_R8);
          ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          CompilerGLSL::to_expression_abi_cxx11_(&local_138,&this->super_CompilerGLSL,uVar26,true);
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
          goto LAB_0022101b;
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar26 = local_118;
        CompilerGLSL::to_expression_abi_cxx11_(&local_138,&this->super_CompilerGLSL,local_118,true);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
      }
      else {
        local_138._M_dataplus._M_p._0_4_ = (pSVar10->basevariable).id;
        cVar14 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(&(this->pull_model_inputs)._M_h,(key_type *)&local_138);
        if ((cVar14.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) ||
           (pSVar16->basetype == Struct)) {
          if ((char *)local_b8._M_string_length != (char *)0x0) {
            bVar30 = Compiler::is_pointer((Compiler *)this,local_d0);
            if (bVar30) {
              if (*local_e8 == '\0') {
                ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
              }
              join<std::__cxx11::string&,char_const(&)[2]>
                        (&local_138,(spirv_cross *)&local_b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x2bb1d1,pacVar23);
              ::std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
            }
            else {
              join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                        (&local_138,(spirv_cross *)&local_b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x2bb1d1,(char (*) [2])__return_storage_ptr__,in_R8);
              ::std::__cxx11::string::operator=
                        ((string *)__return_storage_ptr__,(string *)&local_138);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p);
            }
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          to_restrict(this,local_118,true);
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar26 = local_118;
          CompilerGLSL::to_expression_abi_cxx11_
                    (&local_138,&this->super_CompilerGLSL,local_118,true);
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
        }
        else {
          if ((char *)local_b8._M_string_length != (char *)0x0) {
            join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                      (&local_138,(spirv_cross *)&local_b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bb1d1
                       ,(char (*) [2])__return_storage_ptr__,in_R8);
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_138)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p);
            }
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar26 = local_118;
          CompilerGLSL::to_expression_abi_cxx11_
                    (&local_138,&this->super_CompilerGLSL,local_118,true);
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
        }
      }
LAB_002209b0:
      psVar7 = &local_138;
    }
    else {
      if ((char *)local_b8._M_string_length != (char *)0x0) {
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                  (&local_138,(spirv_cross *)&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bb1d1,
                   (char (*) [2])__return_storage_ptr__,in_R8);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
      }
      bVar30 = is_var_runtime_size_array(this,pSVar10);
      if ((!bVar30) &&
         (pcVar18 = descriptor_address_space(this,local_118,(StorageClass)local_d8,(char *)0x0),
         pcVar18 != (char *)0x0)) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      EVar9 = Compiler::get_execution_model((Compiler *)this);
      if ((local_111 & EVar9 == ExecutionModelTessellationControl & local_e0[0] - 0xbU < 2) == 1) {
        bVar30 = Compiler::is_tessellating_triangles((Compiler *)this);
        uVar26 = local_118;
        bVar8 = local_e0[0] != 0xc;
        iVar20 = (uint)bVar8 * 2 + 2;
        if (bVar30) {
          iVar20 = (uint)bVar8 * 2 + 1;
        }
        local_110._M_dataplus._M_p._0_4_ = iVar20;
        if (bVar8 || !bVar30) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          CompilerGLSL::to_expression_abi_cxx11_(&local_138,&this->super_CompilerGLSL,uVar26,true);
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                    (&local_138,(spirv_cross *)0x2be9ba,(char (*) [2])&local_110,(uint *)0x2be8bf,
                     (char (*) [2])in_R8);
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
LAB_0022101b:
          _Var28._M_p = local_138._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_002209c3;
          goto LAB_002209be;
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        CompilerGLSL::to_expression_abi_cxx11_(&local_138,&this->super_CompilerGLSL,uVar26,true);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
        goto LAB_002209b0;
      }
      bVar30 = is_var_runtime_size_array(this,pSVar10);
      uVar26 = local_118;
      if (!bVar30) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                  (&local_138,this,local_d0,(ulong)local_118);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        pcVar18 = to_restrict(this,uVar26,true);
        if (*pcVar18 != '\0') {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        CompilerGLSL::to_expression_abi_cxx11_(&local_110,&this->super_CompilerGLSL,uVar26,true);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_110._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        if (local_138._M_string_length != 0) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
        }
        goto LAB_002209b0;
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_110,&this->super_CompilerGLSL,local_118,true);
      puVar13 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x2bb1d1);
      psVar22 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_138.field_2._M_allocated_capacity = *psVar22;
        local_138.field_2._8_8_ = puVar13[3];
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar22;
        local_138._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_138._M_string_length = puVar13[1];
      *puVar13 = psVar22;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      psVar7 = &local_110;
    }
    _Var28._M_p = *(pointer *)((psVar7->field_2)._M_local_buf + -0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var28._M_p == &psVar7->field_2) goto LAB_002209c3;
  }
  else {
LAB_00220714:
    if (((this->msl_options).force_native_arrays != true) ||
       (bVar30 = Compiler::is_array((Compiler *)this,pSVar16), !bVar30)) {
      if ((char *)local_b8._M_string_length != (char *)0x0) {
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                  (&local_138,(spirv_cross *)&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bb1d1,
                   (char (*) [2])__return_storage_ptr__,in_R8);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar26 = local_118;
      CompilerGLSL::to_expression_abi_cxx11_(&local_138,&this->super_CompilerGLSL,local_118,true);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
      goto LAB_002209b0;
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"thread const ","");
    puVar13 = (undefined8 *)
              ::std::__cxx11::string::_M_append
                        ((char *)&local_110,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
    paVar2 = &local_138.field_2;
    psVar22 = puVar13 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar22) {
      local_138.field_2._M_allocated_capacity = *psVar22;
      local_138.field_2._8_8_ = puVar13[3];
      local_138._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar22;
      local_138._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_138._M_string_length = puVar13[1];
    *puVar13 = psVar22;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pcVar18 = to_restrict(this,local_118,true);
    if (*pcVar18 != '\0') {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    CompilerGLSL::to_expression_abi_cxx11_(&local_138,&this->super_CompilerGLSL,local_118,true);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar26 = local_118;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
              (&local_138,this,pSVar16,(ulong)local_118);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
    _Var28._M_p = local_138._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == paVar2) goto LAB_002209c3;
  }
LAB_002209be:
  operator_delete(_Var28._M_p);
LAB_002209c3:
  pSVar10 = Compiler::maybe_get_backing_variable((Compiler *)this,uVar26);
  if (pSVar10 != (SPIRVariable *)0x0) {
    local_138._M_dataplus._M_p._0_4_ = (pSVar10->super_IVariant).self.id;
    cVar14 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::find(&(this->atomic_image_vars_emulated)._M_h,(key_type *)&local_138);
    if (cVar14.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
      pBVar15 = ParsedIR::get_decoration_bitset
                          (&(this->super_CompilerGLSL).super_Compiler.ir,
                           (ID)(pSVar10->super_IVariant).self.id);
      local_78[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x2cffdc;
      if ((pBVar15->lower & 0xa00000) == 0) {
        local_78[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x2aec75;
      }
      pSVar16 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + (local_c0->image).type.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_110,this,pSVar16,0);
      join<char_const(&)[3],char_const*&,char_const(&)[15],std::__cxx11::string>
                (&local_138,(spirv_cross *)0x2d07c3,(char (*) [3])local_78,(char **)"device atomic_"
                 ,(char (*) [15])&local_110,in_R9);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
      paVar2 = &local_138.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      paVar3 = &local_110.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar3) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_98,&this->super_CompilerGLSL,uVar26,true);
      plVar17 = (long *)::std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x2d3b74);
      puVar24 = (ulong *)(plVar17 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar17 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_110.field_2._M_allocated_capacity = *puVar24;
        local_110.field_2._8_8_ = plVar17[3];
        local_110._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_110.field_2._M_allocated_capacity = *puVar24;
        local_110._M_dataplus._M_p = (pointer)*plVar17;
      }
      local_110._M_string_length = plVar17[1];
      *plVar17 = (long)puVar24;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      puVar13 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
      psVar22 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_138.field_2._M_allocated_capacity = *psVar22;
        local_138.field_2._8_8_ = puVar13[3];
        local_138._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar22;
        local_138._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_138._M_string_length = puVar13[1];
      *puVar13 = psVar22;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar3) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
    }
  }
  this->is_using_builtin_array = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::argument_decl(const SPIRFunction::Parameter &arg)
{
	auto &var = get<SPIRVariable>(arg.id);
	auto &var_type = get<SPIRType>(arg.type);
	StorageClass type_storage = var_type.storage;

	// Physical pointer types are passed by pointer, not reference.
	auto &data_type = get_variable_data_type(var);
	bool passed_by_value = is_physical_pointer(var_type);
	auto &type = passed_by_value ? var_type : data_type;

	// If we need to modify the name of the variable, make sure we use the original variable.
	// Our alias is just a shadow variable.
	uint32_t name_id = var.self;
	if (arg.alias_global_variable && var.basevariable)
		name_id = var.basevariable;

	bool constref = !arg.alias_global_variable && !passed_by_value && is_pointer(var_type) && arg.write_count == 0;
	// Framebuffer fetch is plain value, const looks out of place, but it is not wrong.
	if (type_is_msl_framebuffer_fetch(type))
		constref = false;
	else if (type_storage == StorageClassUniformConstant)
		constref = true;

	bool type_is_image = type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage ||
	                     type.basetype == SPIRType::Sampler;
	bool type_is_tlas = type.basetype == SPIRType::AccelerationStructure;

	// For opaque types we handle const later due to descriptor address spaces.
	const char *cv_qualifier = (constref && !type_is_image) ? "const " : "";
	string decl;

	// If this is a combined image-sampler for a 2D image with floating-point type,
	// we emitted the 'spvDynamicImageSampler' type, and this is *not* an alias parameter
	// for a global, then we need to emit a "dynamic" combined image-sampler.
	// Unfortunately, this is necessary to properly support passing around
	// combined image-samplers with Y'CbCr conversions on them.
	bool is_dynamic_img_sampler = !arg.alias_global_variable && type.basetype == SPIRType::SampledImage &&
	                              type.image.dim == Dim2D && type_is_floating_point(get<SPIRType>(type.image.type)) &&
	                              spv_function_implementations.count(SPVFuncImplDynamicImageSampler);

	// Allow Metal to use the array<T> template to make arrays a value type
	string address_space = get_argument_address_space(var);
	bool builtin = has_decoration(var.self, DecorationBuiltIn);
	auto builtin_type = BuiltIn(get_decoration(arg.id, DecorationBuiltIn));

	if (var.basevariable && (var.basevariable == stage_in_ptr_var_id || var.basevariable == stage_out_ptr_var_id))
		decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	else if (builtin && !is_mesh_shader())
	{
		// Only use templated array for Clip/Cull distance when feasible.
		// In other scenarios, we need need to override array length for tess levels (if used as outputs),
		// or we need to emit the expected type for builtins (uint vs int).
		auto storage = get<SPIRType>(var.basetype).storage;

		if (storage == StorageClassInput &&
		    (builtin_type == BuiltInTessLevelInner || builtin_type == BuiltInTessLevelOuter))
		{
			is_using_builtin_array = false;
		}
		else if (builtin_type != BuiltInClipDistance && builtin_type != BuiltInCullDistance)
		{
			is_using_builtin_array = true;
		}

		if (storage == StorageClassOutput && variable_storage_requires_stage_io(storage) &&
		    !is_stage_output_builtin_masked(builtin_type))
			is_using_builtin_array = true;

		if (is_using_builtin_array)
			decl = join(cv_qualifier, builtin_type_decl(builtin_type, arg.id));
		else
			decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	}
	else if (is_var_runtime_size_array(var))
	{
		const auto *parent_type = &get<SPIRType>(type.parent_type);
		auto type_name = type_to_glsl(*parent_type, arg.id);
		if (type.basetype == SPIRType::AccelerationStructure)
			decl = join("spvDescriptorArray<", type_name, ">");
		else if (type_is_image)
			decl = join("spvDescriptorArray<", cv_qualifier, type_name, ">");
		else
			decl = join("spvDescriptorArray<", address_space, " ", type_name, "*>");
		address_space = "const";
	}
	else if ((type_storage == StorageClassUniform || type_storage == StorageClassStorageBuffer) && is_array(type))
	{
		is_using_builtin_array = true;
		decl += join(cv_qualifier, type_to_glsl(type, arg.id), "*");
	}
	else if (is_dynamic_img_sampler)
	{
		decl = join(cv_qualifier, "spvDynamicImageSampler<", type_to_glsl(get<SPIRType>(type.image.type)), ">");
		// Mark the variable so that we can handle passing it to another function.
		set_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);
	}
	else
	{
		// The type is a pointer type we need to emit cv_qualifier late.
		if (is_pointer(data_type))
		{
			decl = type_to_glsl(type, arg.id);
			if (*cv_qualifier != '\0')
				decl += join(" ", cv_qualifier);
		}
		else
		{
			decl = join(cv_qualifier, type_to_glsl(type, arg.id));
		}
	}

	if (passed_by_value || (!builtin && !is_pointer(var_type) &&
	                        (type_storage == StorageClassFunction || type_storage == StorageClassGeneric)))
	{
		// If the argument is a pure value and not an opaque type, we will pass by value.
		if (msl_options.force_native_arrays && is_array(type))
		{
			// We are receiving an array by value. This is problematic.
			// We cannot be sure of the target address space since we are supposed to receive a copy,
			// but this is not possible with MSL without some extra work.
			// We will have to assume we're getting a reference in thread address space.
			// If we happen to get a reference in constant address space, the caller must emit a copy and pass that.
			// Thread const therefore becomes the only logical choice, since we cannot "create" a constant array from
			// non-constant arrays, but we can create thread const from constant.
			decl = string("thread const ") + decl;
			decl += " (&";
			const char *restrict_kw = to_restrict(name_id, true);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);
			decl += ")";
			decl += type_to_array_glsl(type, name_id);
		}
		else
		{
			if (!address_space.empty())
				decl = join(address_space, " ", decl);
			decl += " ";
			decl += to_expression(name_id);
		}
	}
	else if (is_array(type) && !type_is_image)
	{
		// Arrays of opaque types are special cased.
		if (!address_space.empty())
			decl = join(address_space, " ", decl);

		// spvDescriptorArray absorbs the address space inside the template.
		if (!is_var_runtime_size_array(var))
		{
			const char *argument_buffer_space = descriptor_address_space(name_id, type_storage, nullptr);
			if (argument_buffer_space)
			{
				decl += " ";
				decl += argument_buffer_space;
			}
		}

		// Special case, need to override the array size here if we're using tess level as an argument.
		if (is_tesc_shader() && builtin &&
		    (builtin_type == BuiltInTessLevelInner || builtin_type == BuiltInTessLevelOuter))
		{
			uint32_t array_size = get_physical_tess_level_array_size(builtin_type);
			if (array_size == 1)
			{
				decl += " &";
				decl += to_expression(name_id);
			}
			else
			{
				decl += " (&";
				decl += to_expression(name_id);
				decl += ")";
				decl += join("[", array_size, "]");
			}
		}
		else if (is_var_runtime_size_array(var))
		{
			decl += " " + to_expression(name_id);
		}
		else
		{
			auto array_size_decl = type_to_array_glsl(type, name_id);
			if (array_size_decl.empty())
				decl += "& ";
			else
				decl += " (&";

			const char *restrict_kw = to_restrict(name_id, true);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);

			if (!array_size_decl.empty())
			{
				decl += ")";
				decl += array_size_decl;
			}
		}
	}
	else if (!type_is_image && !type_is_tlas &&
	         (!pull_model_inputs.count(var.basevariable) || type.basetype == SPIRType::Struct))
	{
		// If this is going to be a reference to a variable pointer, the address space
		// for the reference has to go before the '&', but after the '*'.
		if (!address_space.empty())
		{
			if (is_pointer(data_type))
			{
				if (*cv_qualifier == '\0')
					decl += ' ';
				decl += join(address_space, " ");
			}
			else
				decl = join(address_space, " ", decl);
		}

		decl += "&";
		decl += " ";
		decl += to_restrict(name_id, true);
		decl += to_expression(name_id);
	}
	else if (type_is_image || type_is_tlas)
	{
		if (is_var_runtime_size_array(var))
		{
			decl = address_space + " " + decl + " " + to_expression(name_id);
		}
		else if (type.array.empty())
		{
			// For non-arrayed types we can just pass opaque descriptors by value.
			// This fixes problems if descriptors are passed by value from argument buffers and plain descriptors
			// in same shader.
			// There is no address space we can actually use, but value will work.
			// This will break if applications attempt to pass down descriptor arrays as arguments, but
			// fortunately that is extremely unlikely ...
			decl += " ";
			decl += to_expression(name_id);
		}
		else
		{
			const char *img_address_space = descriptor_address_space(name_id, type_storage, "thread const");
			decl = join(img_address_space, " ", decl);
			decl += "& ";
			decl += to_expression(name_id);
		}
	}
	else
	{
		if (!address_space.empty())
			decl = join(address_space, " ", decl);
		decl += " ";
		decl += to_expression(name_id);
	}

	// Emulate texture2D atomic operations
	auto *backing_var = maybe_get_backing_variable(name_id);
	if (backing_var && atomic_image_vars_emulated.count(backing_var->self))
	{
		auto &flags = ir.get_decoration_bitset(backing_var->self);
		const char *cv_flags = decoration_flags_signal_volatile(flags) ? "volatile " : "";
		decl += join(", ", cv_flags, "device atomic_", type_to_glsl(get<SPIRType>(var_type.image.type), 0));
		decl += "* " + to_expression(name_id) + "_atomic";
	}

	is_using_builtin_array = false;

	return decl;
}